

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

void parse_whitespace(D_Parser *ap,d_loc_t *loc,void **p_globals)

{
  uint32 *puVar1;
  int iVar2;
  Parser *p;
  SNode *pSVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  p = (Parser *)ap[3].initial_scope;
  p->start = loc->s;
  iVar8 = exhaustive_parse(p,*(int *)&(ap[1].initial_scope)->updates);
  if ((iVar8 == 0) && (pSVar3 = p->accept, pSVar3 != (SNode *)0x0)) {
    iVar8 = loc->col;
    iVar2 = loc->line;
    pcVar4 = (pSVar3->loc).s;
    pcVar5 = (pSVar3->loc).pathname;
    iVar6 = (pSVar3->loc).col;
    iVar7 = (pSVar3->loc).line;
    loc->ws = (pSVar3->loc).ws;
    loc->col = iVar6;
    loc->line = iVar7;
    loc->s = pcVar4;
    loc->pathname = pcVar5;
    if (loc->line == 1) {
      loc->col = loc->col + iVar8;
    }
    pSVar3 = p->accept;
    loc->line = iVar2 + (pSVar3->loc).line + -1;
    puVar1 = &pSVar3->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_SNode(p,pSVar3);
    }
    p->accept = (SNode *)0x0;
  }
  return;
}

Assistant:

void parse_whitespace(D_Parser *ap, d_loc_t *loc, void **p_globals) {
  Parser *pp = ((Parser *)ap)->whitespace_parser;
  (void)p_globals;
  pp->start = loc->s;
  if (!exhaustive_parse(pp, ((Parser *)ap)->t->whitespace_state)) {
    if (pp->accept) {
      uint old_col = loc->col, old_line = loc->line;
      *loc = pp->accept->loc;
      if (loc->line == 1) loc->col = old_col + loc->col;
      loc->line = old_line + (pp->accept->loc.line - 1);
      unref_sn(pp, pp->accept);
      pp->accept = NULL;
    }
  }
}